

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_ExpectAtEnd_Test::TestBody
          (CodedStreamTest_ExpectAtEnd_Test *this)

{
  Limit limit;
  char *in_R9;
  uint32_t value;
  CodedInputStream coded_input;
  ArrayInputStream input;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  internal local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string local_b0;
  uint32_t local_8c;
  CodedInputStream local_88;
  ArrayInputStream local_30;
  
  ArrayInputStream::ArrayInputStream
            (&local_30,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,-1);
  local_88.buffer_ = (uint8_t *)0x0;
  local_88.buffer_end_ = (uint8_t *)0x0;
  local_88.total_bytes_read_ = 0;
  local_88.overflow_bytes_ = 0;
  local_88.last_tag_ = 0;
  local_88.legitimate_message_end_ = false;
  local_88.aliasing_enabled_ = false;
  local_88.force_eager_parsing_ = false;
  local_88.current_limit_ = 0x7fffffff;
  local_88.buffer_size_after_limit_ = 0;
  local_88.total_bytes_limit_ = 0x7fffffff;
  local_88.recursion_budget_ = CodedInputStream::default_recursion_limit_;
  local_88.recursion_limit_ = CodedInputStream::default_recursion_limit_;
  local_88.extension_pool_ = (DescriptorPool *)0x0;
  local_88.extension_factory_ = (MessageFactory *)0x0;
  local_88.input_ = &local_30.super_ZeroCopyInputStream;
  CodedInputStream::Refresh(&local_88);
  if ((local_88.buffer_ == local_88.buffer_end_) &&
     ((local_88.buffer_size_after_limit_ != 0 ||
      (local_88.total_bytes_read_ == local_88.current_limit_)))) {
    local_88.last_tag_ = 0;
    local_88.legitimate_message_end_ = true;
    local_c0[0] = (internal)0x0;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,local_c0,(AssertionResult *)"coded_input.ExpectAtEnd()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x575,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  limit = CodedInputStream::PushLimit(&local_88,4);
  if ((int)local_88.buffer_end_ - (int)local_88.buffer_ < 4) {
    local_c0[0] = (internal)CodedInputStream::ReadLittleEndian32Fallback(&local_88,&local_8c);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c0[0]) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b0,local_c0,(AssertionResult *)"coded_input.ReadLittleEndian32(&value)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0x57a,local_b0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
    }
  }
  else {
    local_8c = *(uint32_t *)local_88.buffer_;
    local_88.buffer_ = (uint8_t *)((long)local_88.buffer_ + 4);
  }
  if ((local_88.buffer_ == local_88.buffer_end_) &&
     ((local_88.buffer_size_after_limit_ != 0 ||
      (local_88.total_bytes_read_ == local_88.current_limit_)))) {
    local_88.last_tag_ = 0;
    local_88.legitimate_message_end_ = true;
  }
  else {
    local_c0[0] = (internal)0x0;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,local_c0,(AssertionResult *)"coded_input.ExpectAtEnd()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x57b,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  CodedInputStream::PopLimit(&local_88,limit);
  if ((local_88.buffer_ == local_88.buffer_end_) &&
     ((local_88.buffer_size_after_limit_ != 0 ||
      (local_88.total_bytes_read_ == local_88.current_limit_)))) {
    local_88.last_tag_ = 0;
    local_88.legitimate_message_end_ = true;
    local_c0[0] = (internal)0x0;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,local_c0,(AssertionResult *)"coded_input.ExpectAtEnd()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x57e,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  CodedInputStream::~CodedInputStream(&local_88);
  return;
}

Assistant:

TEST_F(CodedStreamTest, ExpectAtEnd) {
  // Test ExpectAtEnd(), which is based on limits.
  ArrayInputStream input(buffer_, sizeof(buffer_));
  CodedInputStream coded_input(&input);

  EXPECT_FALSE(coded_input.ExpectAtEnd());

  CodedInputStream::Limit limit = coded_input.PushLimit(4);

  uint32_t value;
  EXPECT_TRUE(coded_input.ReadLittleEndian32(&value));
  EXPECT_TRUE(coded_input.ExpectAtEnd());

  coded_input.PopLimit(limit);
  EXPECT_FALSE(coded_input.ExpectAtEnd());
}